

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_debug.c
# Opt level: O3

int cmd_debug_store(ly_ctx **ctx,yl_opt *yo,char *posv)

{
  int iVar1;
  long lVar2;
  
  if (posv == (char *)0x0) {
    __assert_fail("posv",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/tools/lint/cmd_debug.c"
                  ,0x6a,"int cmd_debug_store(struct ly_ctx **, struct yl_opt *, const char *)");
  }
  lVar2 = 8;
  do {
    iVar1 = strcasecmp(posv,*(char **)(&UNK_0011c9c8 + lVar2));
    if (iVar1 == 0) {
      yo->dbg_groups = yo->dbg_groups | *(uint *)((long)&dg[0].name + lVar2);
      return 0;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x38);
  yl_log('\x01',"Unknown debug group \"%s\".",posv);
  return 1;
}

Assistant:

int
cmd_debug_store(struct ly_ctx **ctx, struct yl_opt *yo, const char *posv)
{
    (void) ctx;
    uint32_t i;
    ly_bool set;

    assert(posv);

    set = 0;
    for (i = 0; i < DG_LENGTH; i++) {
        if (!strcasecmp(posv, dg[i].name)) {
            yo->dbg_groups |= dg[i].flag;
            set = 1;
            break;
        }
    }

    if (!set) {
        YLMSG_E("Unknown debug group \"%s\".", posv);
        return 1;
    }

    return 0;
}